

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::register_call_out_argument(CompilerGLSL *this,uint32_t id)

{
  uint32_t id_00;
  SPIRVariable *pSVar1;
  SPIRVariable *var;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  Compiler::register_write(&this->super_Compiler,id);
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar1 != (SPIRVariable *)0x0) {
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar1->super_IVariant).self);
    flush_variable_declaration(this,id_00);
  }
  return;
}

Assistant:

void CompilerGLSL::register_call_out_argument(uint32_t id)
{
	register_write(id);

	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		flush_variable_declaration(var->self);
}